

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::reallocate
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t size)

{
  Expression **ppEVar1;
  MixedArena *this_00;
  size_t sVar2;
  Expression **ppEVar3;
  size_t sVar4;
  
  ppEVar1 = this->data;
  this_00 = (MixedArena *)this[1].data;
  this->allocatedElements = size;
  ppEVar3 = (Expression **)MixedArena::allocSpace(this_00,size << 3,8);
  this->data = ppEVar3;
  sVar2 = this->usedElements;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      this->data[sVar4] = ppEVar1[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }